

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O3

void Abc_NtkLutminConstruct(Abc_Ntk_t *pNtkClp,Abc_Ntk_t *pNtkDec,int nLutSize,int fVerbose)

{
  Abc_Obj_t *pObj;
  Vec_Ptr_t *__ptr;
  Abc_Obj_t *pAVar1;
  long lVar2;
  long lVar3;
  
  __ptr = Abc_NtkDfs(pNtkClp,0);
  if (0 < __ptr->nSize) {
    lVar3 = 0;
    do {
      pObj = (Abc_Obj_t *)__ptr->pArray[lVar3];
      if (nLutSize < (pObj->vFanins).nSize) {
        pAVar1 = Abc_NtkBddDecompose(pNtkDec,pObj,nLutSize,fVerbose);
        (pObj->field_6).pCopy = pAVar1;
      }
      else {
        pAVar1 = Abc_NtkDupObj(pNtkDec,pObj,0);
        (pObj->field_6).pCopy = pAVar1;
        if (0 < (pObj->vFanins).nSize) {
          lVar2 = 0;
          do {
            Abc_ObjAddFanin((pObj->field_6).pCopy,
                            *(Abc_Obj_t **)
                             ((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar2]] + 0x40)
                           );
            lVar2 = lVar2 + 1;
          } while (lVar2 < (pObj->vFanins).nSize);
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < __ptr->nSize);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return;
}

Assistant:

void Abc_NtkLutminConstruct( Abc_Ntk_t * pNtkClp, Abc_Ntk_t * pNtkDec, int nLutSize, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode, * pFanin;
    int i, k;
    vNodes = Abc_NtkDfs( pNtkClp, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( Abc_ObjFaninNum(pNode) <= nLutSize )
        {
            pNode->pCopy = Abc_NtkDupObj( pNtkDec, pNode, 0 );
            Abc_ObjForEachFanin( pNode, pFanin, k )
                Abc_ObjAddFanin( pNode->pCopy, pFanin->pCopy );
        }
        else
            pNode->pCopy = Abc_NtkBddDecompose( pNtkDec, pNode, nLutSize, fVerbose );
    }
    Vec_PtrFree( vNodes );
}